

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O2

void __thiscall
duckdb::ColumnReader::
PlainSkipTemplatedInternal<duckdb::TemplatedParquetValueConversion<unsigned_long>,true,false>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          idx_t row_offset)

{
  ParquetColumnSchema *pPVar1;
  data_ptr_t pdVar2;
  ulong uVar3;
  uint64_t uVar4;
  
  uVar3 = num_values + row_offset;
  pdVar2 = plain_data->ptr;
  uVar4 = plain_data->len;
  pPVar1 = this->column_schema;
  for (; row_offset < uVar3; row_offset = row_offset + 1) {
    if (pPVar1->max_define == (ulong)defines[row_offset]) {
      uVar4 = uVar4 - 8;
      plain_data->len = uVar4;
      pdVar2 = pdVar2 + 8;
      plain_data->ptr = pdVar2;
    }
  }
  return;
}

Assistant:

void PlainSkipTemplatedInternal(ByteBuffer &plain_data, const uint8_t *__restrict defines,
	                                const uint64_t num_values, idx_t row_offset = 0) {
		if (!HAS_DEFINES && CONVERSION::PlainConstantSize() > 0) {
			if (CHECKED) {
				plain_data.inc(num_values * CONVERSION::PlainConstantSize());
			} else {
				plain_data.unsafe_inc(num_values * CONVERSION::PlainConstantSize());
			}
			return;
		}
		for (idx_t row_idx = row_offset; row_idx < row_offset + num_values; row_idx++) {
			if (HAS_DEFINES && defines[row_idx] != MaxDefine()) {
				continue;
			}
			CONVERSION::template PlainSkip<CHECKED>(plain_data, *this);
		}
	}